

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O0

void __thiscall google::protobuf::MapValueRef::SetStringValue(MapValueRef *this,string_view value)

{
  char *pcVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  const_pointer pvVar4;
  string_view sVar5;
  LogMessage local_38;
  Voidify local_21;
  MapValueRef *local_20;
  MapValueRef *this_local;
  string_view value_local;
  
  value_local._M_len = (size_t)value._M_str;
  this_local = (MapValueRef *)value._M_len;
  local_20 = this;
  CVar2 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar2 != CPPTYPE_STRING) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map_field.h"
               ,0x2f7);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [34])"Protocol Buffer map usage error:\n");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [28])"MapValueRef::SetStringValue");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [22])" type does not match\n");
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [14])"  Expected : ");
    sVar5 = FieldDescriptor::CppTypeName(CPPTYPE_STRING);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,sVar5);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,(char (*) [2])0x718b9a)
    ;
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar3,(char (*) [14])"  Actual   : ");
    CVar2 = MapValueConstRef::type(&this->super_MapValueConstRef);
    sVar5 = FieldDescriptor::CppTypeName(CVar2);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,sVar5);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  pcVar1 = (char *)(this->super_MapValueConstRef).data_;
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::basic_string_view<char,_std::char_traits<char>_>::size
            ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  std::__cxx11::string::assign(pcVar1,(ulong)pvVar4);
  return;
}

Assistant:

void SetStringValue(absl::string_view value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_STRING, "MapValueRef::SetStringValue");
    reinterpret_cast<std::string*>(data_)->assign(value.data(), value.size());
  }